

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
::remove_maximal_cell
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
           *this,ID_index cellID)

{
  Dictionary *pDVar1;
  uint uVar2;
  long lVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  pointer puVar4;
  Index columnIndex1;
  _Hash_node_base *p_Var5;
  mapped_type *pmVar6;
  ulong uVar7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  pointer puVar11;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_matrix_include_gudhi_Persistence_matrix_Chain_matrix_h:760:51)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_matrix_include_gudhi_Persistence_matrix_Chain_matrix_h:760:51)>
  __comp_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> colToSwap;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  ID_index local_34;
  
  uVar7 = (this->super_Chain_vine_swap_option).super_type.pivotToPosition_._M_h._M_bucket_count;
  uVar8 = (ulong)cellID % uVar7;
  p_Var9 = (this->super_Chain_vine_swap_option).super_type.pivotToPosition_._M_h._M_buckets[uVar8];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var9->_M_nxt, p_Var10 = p_Var9, *(ID_index *)&p_Var9->_M_nxt[1]._M_nxt != cellID))
  {
    while (p_Var9 = p_Var5, p_Var5 = p_Var9->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar7 != uVar8) ||
         (p_Var10 = p_Var9, *(uint *)&p_Var5[1]._M_nxt == cellID)) goto LAB_0013f414;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_0013f414:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var10->_M_nxt;
  }
  if (p_Var5 != (_Hash_node_base *)0x0) {
    uVar2 = *(uint *)((long)&p_Var5[1]._M_nxt + 4);
    local_34 = cellID;
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->pivotToColumnIndex_,&local_34);
    columnIndex1 = *pmVar6;
    if (uVar2 != (this->super_Chain_vine_swap_option).super_type.
                 super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
                 .nextPosition_ - 1) {
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (uint *)0x0;
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&local_58,(this->matrix_)._M_h._M_element_count);
      __first._M_current =
           local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      __last._M_current =
           local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      for (p_Var5 = (this->super_Chain_vine_swap_option).super_type.pivotToPosition_._M_h.
                    _M_before_begin._M_nxt;
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = __first._M_current,
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __last._M_current, p_Var5 != (_Hash_node_base *)0x0;
          p_Var5 = p_Var5->_M_nxt) {
        if (uVar2 < *(uint *)((long)&p_Var5[1]._M_nxt + 4)) {
          pmVar6 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->pivotToColumnIndex_,(key_type *)(p_Var5 + 1));
          if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
                       (iterator)
                       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,pmVar6);
          }
          else {
            *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = *pmVar6;
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        __first._M_current =
             local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        __last._M_current =
             local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      if (__first._M_current != __last._M_current) {
        pDVar1 = &(this->super_Chain_vine_swap_option).super_type.pivotToPosition_;
        uVar7 = (long)__last._M_current - (long)__first._M_current >> 2;
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        __comp._M_comp.this =
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
              *)this;
        __comp._M_comp.pivotToPosition = pDVar1;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>::remove_maximal_cell(unsigned_int)::_lambda(unsigned_int,unsigned_int)_1_>>
                  (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp);
        __comp_00._M_comp.this =
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
              *)this;
        __comp_00._M_comp.pivotToPosition = pDVar1;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>::remove_maximal_cell(unsigned_int)::_lambda(unsigned_int,unsigned_int)_1_>>
                  (__first,__last,__comp_00);
      }
      puVar4 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar11 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          columnIndex1 = Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
                         ::vine_swap(&this->super_Chain_vine_swap_option,columnIndex1,*puVar11);
          puVar11 = puVar11 + 1;
        } while (puVar11 != puVar4);
      }
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (Index *)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    _remove_last(this,columnIndex1);
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::remove_maximal_cell(ID_index cellID)
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'remove_maximal_cell' is not implemented for the chosen options.");
  static_assert(Master_matrix::Option_list::has_map_column_container &&
                    Master_matrix::Option_list::has_vine_update &&
                    Master_matrix::Option_list::has_column_pairings,
                "'remove_maximal_cell' is not implemented for the chosen options.");

  // TODO: find simple test to verify that col at columnIndex is maximal even without row access.

  const auto& pivotToPosition = Swap_opt::CP::pivotToPosition_;
  auto it = pivotToPosition.find(cellID);
  if (it == pivotToPosition.end()) return;  // cell does not exists. TODO: put an assert instead?
  Pos_index startPos = it->second;
  Index startIndex = pivotToColumnIndex_.at(cellID);

  if (startPos != _nextPosition() - 1) {
    std::vector<Index> colToSwap;
    colToSwap.reserve(matrix_.size());

    for (auto& p : pivotToPosition) {
      if (p.second > startPos) colToSwap.push_back(pivotToColumnIndex_.at(p.first));
    }
    std::sort(colToSwap.begin(), colToSwap.end(), [&](Index c1, Index c2) {
      return pivotToPosition.at(get_pivot(c1)) < pivotToPosition.at(get_pivot(c2));
    });

    for (Index i : colToSwap) {
      startIndex = Swap_opt::vine_swap(startIndex, i);
    }
  }

  _remove_last(startIndex);
}